

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_NtkPrintPaths(Acb_Ntk_t *p)

{
  ulong uVar1;
  
  if (1 < (p->vObjType).nSize) {
    uVar1 = 1;
    do {
      if ((long)(p->vObjType).nSize <= (long)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar1] != '\0') {
        printf("Obj = %5d :   ",uVar1 & 0xffffffff);
        if ((long)(p->vLevelD).nSize <= (long)uVar1) {
LAB_00383bf2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        printf("LevelD = %5d  ",(ulong)(uint)(p->vLevelD).pArray[uVar1]);
        if ((long)(p->vLevelR).nSize <= (long)uVar1) goto LAB_00383bf2;
        printf("LevelR = %5d    ",(ulong)(uint)(p->vLevelR).pArray[uVar1]);
        if ((long)(p->vPathD).nSize <= (long)uVar1) goto LAB_00383bf2;
        printf("PathD = %5d  ",(ulong)(uint)(p->vPathD).pArray[uVar1]);
        if ((long)(p->vPathR).nSize <= (long)uVar1) goto LAB_00383bf2;
        printf("PathR = %5d    ",(ulong)(uint)(p->vPathR).pArray[uVar1]);
        if (((long)(p->vPathD).nSize <= (long)uVar1) || ((long)(p->vPathR).nSize <= (long)uVar1))
        goto LAB_00383bf2;
        printf("Paths = %5d  ",(ulong)(uint)((p->vPathR).pArray[uVar1] * (p->vPathD).pArray[uVar1]))
        ;
        putchar(10);
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)(p->vObjType).nSize);
  }
  return;
}

Assistant:

void Acb_NtkPrintPaths( Acb_Ntk_t * p )
{
    int iObj;
    Acb_NtkForEachObj( p, iObj )
    {
        printf( "Obj = %5d :   ",   iObj );
        printf( "LevelD = %5d  ",   Acb_ObjLevelD(p, iObj) );
        printf( "LevelR = %5d    ", Acb_ObjLevelR(p, iObj) );
        printf( "PathD = %5d  ",    Acb_ObjPathD(p, iObj) );
        printf( "PathR = %5d    ",  Acb_ObjPathR(p, iObj) );
        printf( "Paths = %5d  ",    Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj) );
        printf( "\n" );
    }
}